

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AArch64InstPrinter.c
# Opt level: O1

void printShifter(MCInst *MI,uint OpNum,SStream *O)

{
  cs_detail *pcVar1;
  undefined4 uVar2;
  MCOperand *op;
  ulong uVar3;
  uint uVar4;
  undefined *puVar5;
  uint uVar6;
  uint val;
  
  op = MCInst_getOperand(MI,OpNum);
  uVar3 = MCOperand_getImm(op);
  uVar6 = (uint)(uVar3 >> 6) & 7;
  val = (uint)uVar3 & 0x3f;
  if ((uVar3 & 0x3f) != 0 || (uVar3 >> 6 & 7) != 0) {
    if (uVar6 < 5) {
      puVar5 = &DAT_001de8d4 + *(int *)(&DAT_001de8d4 + (ulong)uVar6 * 4);
    }
    else {
      puVar5 = (undefined *)0x0;
    }
    SStream_concat(O,", %s ",puVar5);
    printInt32BangDec(O,val);
    if (MI->csh->detail != CS_OPT_OFF) {
      uVar4 = 0xfffffffe;
      if (uVar6 < 5) {
        uVar4 = uVar6 - 1;
      }
      uVar2 = 1;
      if (uVar4 < 4) {
        uVar2 = *(undefined4 *)(&DAT_001e02e4 + (ulong)uVar4 * 4);
      }
      pcVar1 = MI->flat_insn->detail;
      *(undefined4 *)
       (pcVar1->regs_write + (ulong)((uint)(pcVar1->field_6).x86.opcode[2] * 0x30) + 7) = uVar2;
      pcVar1 = MI->flat_insn->detail;
      *(uint *)(pcVar1->regs_write + (ulong)((uint)(pcVar1->field_6).x86.opcode[2] * 0x30) + 0xb) =
           val;
    }
  }
  return;
}

Assistant:

static void printShifter(MCInst *MI, unsigned OpNum, SStream *O)
{
	unsigned Val = (unsigned)MCOperand_getImm(MCInst_getOperand(MI, OpNum));

	// LSL #0 should not be printed.
	if (AArch64_AM_getShiftType(Val) == AArch64_AM_LSL &&
			AArch64_AM_getShiftValue(Val) == 0)
		return;

	SStream_concat(O, ", %s ", AArch64_AM_getShiftExtendName(AArch64_AM_getShiftType(Val)));
	printInt32BangDec(O, AArch64_AM_getShiftValue(Val));
	if (MI->csh->detail) {
		arm64_shifter shifter = ARM64_SFT_INVALID;
		switch(AArch64_AM_getShiftType(Val)) {
			default:	// never reach
			case AArch64_AM_LSL:
				shifter = ARM64_SFT_LSL;
				break;
			case AArch64_AM_LSR:
				shifter = ARM64_SFT_LSR;
				break;
			case AArch64_AM_ASR:
				shifter = ARM64_SFT_ASR;
				break;
			case AArch64_AM_ROR:
				shifter = ARM64_SFT_ROR;
				break;
			case AArch64_AM_MSL:
				shifter = ARM64_SFT_MSL;
				break;
		}

		MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count - 1].shift.type = shifter;
		MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count - 1].shift.value = AArch64_AM_getShiftValue(Val);
	}
}